

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardingTimeCoordinator.cpp
# Opt level: O1

MessageProcessingResult __thiscall
helics::ForwardingTimeCoordinator::checkExecEntry
          (ForwardingTimeCoordinator *this,GlobalFederateId param_1)

{
  pointer pDVar1;
  pointer pDVar2;
  bool bVar3;
  bool bVar4;
  pointer pDVar5;
  ActionMessage execgrant;
  ActionMessage AStack_c8;
  
  bVar4 = TimeDependencies::checkIfReadyForExecEntry
                    (&(this->super_BaseTimeCoordinator).dependencies,false,false);
  if (!bVar4) {
    if ((this->downstream).super_TimeData.mTimeState != exec_requested_iterative) {
      return CONTINUE_PROCESSING;
    }
    pDVar1 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pDVar2 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pDVar1 != pDVar2) {
      bVar4 = true;
      do {
        pDVar5 = pDVar1 + 1;
        if ((pDVar1->dependency == true) &&
           ((bVar3 = true,
            (pDVar1->super_TimeData).minFed.gid != (this->super_BaseTimeCoordinator).mSourceId.gid
            || ((pDVar1->super_TimeData).responseSequenceCounter !=
                (this->downstream).super_TimeData.sequenceCounter)))) {
          bVar4 = false;
        }
        else {
          bVar3 = false;
        }
      } while ((!bVar3) && (pDVar1 = pDVar5, pDVar5 != pDVar2));
      if (!bVar4) {
        return CONTINUE_PROCESSING;
      }
    }
  }
  (this->super_BaseTimeCoordinator).executionMode = true;
  (this->downstream).super_TimeData.next.internalTimeCode = 0;
  (this->downstream).super_TimeData.mTimeState = time_granted;
  (this->downstream).super_TimeData.minDe.internalTimeCode = 0;
  ActionMessage::ActionMessage(&AStack_c8,cmd_exec_grant);
  AStack_c8.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
  transmitTimingMessagesDownstream(this,&AStack_c8,(GlobalFederateId)0x8831d580);
  transmitTimingMessagesUpstream(this,&AStack_c8);
  ActionMessage::~ActionMessage(&AStack_c8);
  return NEXT_STEP;
}

Assistant:

MessageProcessingResult ForwardingTimeCoordinator::checkExecEntry(GlobalFederateId /*triggerFed*/)
{
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;

    if (!dependencies.checkIfReadyForExecEntry(false, false)) {
        bool allowed{false};
        if (downstream.mTimeState == TimeState::exec_requested_iterative) {
            allowed = true;
            for (auto& dep : dependencies) {
                if (dep.dependency) {
                    if (dep.minFed != mSourceId) {
                        allowed = false;
                        break;
                    }
                    if (dep.responseSequenceCounter != downstream.sequenceCounter) {
                        allowed = false;
                        break;
                    }
                }
            }
        }
        if (!allowed) {
            return ret;
        }
    }
    executionMode = true;
    ret = MessageProcessingResult::NEXT_STEP;

    downstream.next = timeZero;
    downstream.mTimeState = TimeState::time_granted;
    downstream.minDe = timeZero;

    ActionMessage execgrant(CMD_EXEC_GRANT);
    execgrant.source_id = mSourceId;
    transmitTimingMessagesDownstream(execgrant);
    transmitTimingMessagesUpstream(execgrant);
    return ret;
}